

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

bool TS_program_map_section::isFullBuff(uint8_t *buffer,int buf_size)

{
  uint uVar1;
  BitStreamReader bitReader;
  
  bitReader.super_BitStream.m_totalBits = 0;
  bitReader.super_BitStream.m_buffer = (uint *)0x0;
  bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
  bitReader.m_curVal = 0;
  bitReader.m_bitLeft = 0;
  BitStreamReader::setBuffer(&bitReader,buffer + (ulong)*buffer + 1,buffer + buf_size);
  uVar1 = BitStreamReader::getBits(&bitReader,8);
  if (((char)uVar1 == '\x02') &&
     (uVar1 = BitStreamReader::getBits(&bitReader,2), (char)uVar1 == '\x02')) {
    BitStreamReader::skipBits(&bitReader,2);
    uVar1 = BitStreamReader::getBits(&bitReader,0xc);
    return (uint8_t *)
           ((long)bitReader.super_BitStream.m_initBuffer +
           (long)((int)((((int)bitReader.super_BitStream.m_buffer -
                         (int)bitReader.super_BitStream.m_initBuffer) * 8 - bitReader.m_bitLeft) +
                       0x20) / 8) + (ulong)(uVar1 & 0xffff)) <= buffer + buf_size;
  }
  return false;
}

Assistant:

bool TS_program_map_section::isFullBuff(uint8_t* buffer, const int buf_size)
{
    const uint8_t pointerField = *buffer;
    const uint8_t* bufEnd = buffer + buf_size;
    BitStreamReader bitReader{};
    try
    {
        bitReader.setBuffer(buffer + 1 + pointerField, buffer + buf_size);

        const auto table_id = bitReader.getBits<uint8_t>(8);
        if (table_id != 0x02)
            return false;

        const auto indicator = bitReader.getBits<uint8_t>(2);  // section syntax indicator and reserved '0' bit
        if (indicator != 2)
            return false;
        bitReader.skipBits(2);  // reserved

        const auto section_length = bitReader.getBits<uint16_t>(12);
        return bitReader.getBuffer() + bitReader.getBitsCount() / 8 + section_length <= bufEnd;
    }
    catch (BitStreamException&)
    {
        return false;
    }
}